

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

LabelInstr * __thiscall Loop::GetLoopTopInstr(Loop *this)

{
  code *pcVar1;
  bool bVar2;
  BasicBlock *pBVar3;
  LabelInstr *pLVar4;
  undefined4 *puVar5;
  
  if ((this->topFunc->field_0x242 & 4) == 0) {
    pLVar4 = this->loopTopLabel;
  }
  else {
    pBVar3 = GetHeadBlock(this);
    pLVar4 = IR::Instr::AsLabelInstr(pBVar3->firstInstr);
  }
  if ((pLVar4 != (LabelInstr *)0x0) && ((pLVar4->field_0x78 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xe3e,"(instr->m_isLoopTop)","instr->m_isLoopTop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return pLVar4;
}

Assistant:

IR::LabelInstr *
Loop::GetLoopTopInstr() const
{
    IR::LabelInstr * instr = nullptr;
    if (this->topFunc->isFlowGraphValid)
    {
        instr = this->GetHeadBlock()->GetFirstInstr()->AsLabelInstr();
    }
    else
    {
        // Flowgraph gets torn down after the globopt, so can't get the loopTop from the head block.
        instr = this->loopTopLabel;
    }
    if (instr)
    {
        Assert(instr->m_isLoopTop);
    }
    return instr;
}